

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O3

bool uWS::WebSocketContext<true,_true>::handleFragment
               (char *data,size_t length,uint remainingBytes,int opCode,bool fin,
               WebSocketState<true> *webSocketState,void *s)

{
  protocol *ppVar1;
  uchar *puVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  protocol *ppVar9;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar10;
  uchar *puVar11;
  ushort *__buf;
  char *pcVar12;
  ushort uVar13;
  uint uVar14;
  bool bVar15;
  string_view compressed;
  string_view compressed_00;
  string_view message;
  undefined1 auVar16 [16];
  undefined1 local_64;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  uVar4 = us_socket_context(1,s);
  lVar5 = us_socket_context_ext(1,uVar4);
  auVar16 = us_socket_ext(1);
  sVar10 = auVar16._8_8_;
  lVar6 = auVar16._0_8_;
  bVar15 = remainingBytes != 0;
  if (2 < opCode) {
    if ((!bVar15 && fin) && (*(int *)(lVar6 + 0x58) == 0)) {
      if (opCode != 10) {
        if (opCode == 9) {
          WebSocket<true,_true>::send((WebSocket<true,_true> *)s,(int)length,data,10,0);
          bVar15 = fu2::abi_400::detail::type_erasure::tables::
                   vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                   ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                            *)(lVar5 + 0x70));
          if (bVar15) {
            return false;
          }
          (**(code **)(lVar5 + 0x78))(lVar5 + 0x60,0x10,s);
          goto LAB_0014d430;
        }
        if (opCode != 8) {
          return false;
        }
        uVar14 = 0;
        if (length < 2) {
          uVar13 = 0;
          ppVar1 = (protocol *)0x0;
          puVar2 = (uchar *)0x0;
        }
        else {
          uVar13 = *(ushort *)data << 8 | *(ushort *)data >> 8;
          puVar11 = (uchar *)0x0;
          ppVar9 = (protocol *)0x0;
          if ((ushort)(uVar13 - 0x3ec) < 3 ||
              ((ushort)(uVar13 - 0x3f4) < 0xbac || (ushort)(uVar13 + 0xec78) < 0xf060))
          goto LAB_0014d47b;
          bVar15 = protocol::isValidUtf8((protocol *)(data + 2),(uchar *)(length - 2),0);
          puVar11 = (uchar *)0x0;
          ppVar9 = (protocol *)0x0;
          uVar14 = 0;
          ppVar1 = (protocol *)(data + 2);
          puVar2 = (uchar *)(length - 2);
          if (!bVar15) goto LAB_0014d47b;
        }
        puVar11 = puVar2;
        ppVar9 = ppVar1;
        uVar14 = (uint)uVar13;
LAB_0014d47b:
        message._M_str = (char *)ppVar9;
        message._M_len = (size_t)puVar11;
        WebSocket<true,_true>::end((WebSocket<true,_true> *)s,uVar14,message);
        return true;
      }
      bVar15 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                        *)(lVar5 + 0x90));
      if (bVar15) {
        return false;
      }
      (**(code **)(lVar5 + 0x98))(lVar5 + 0x80,0x10,s);
LAB_0014d430:
      iVar3 = us_socket_is_closed(1,s);
      if (iVar3 != 0) {
        return true;
      }
      if (*(char *)(lVar6 + 0x5c) == '\0') {
        return false;
      }
      return true;
    }
    std::__cxx11::string::append((char *)(lVar6 + 0x38),(ulong)data);
    lVar8 = (long)(int)length + (long)*(int *)(lVar6 + 0x58);
    uVar14 = (uint)lVar8;
    *(uint *)(lVar6 + 0x58) = uVar14;
    if (bVar15 || !fin) {
      return false;
    }
    if (opCode == 10) {
      bVar15 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                        *)(lVar5 + 0x90));
      if (bVar15) goto LAB_0014d274;
      (**(code **)(lVar5 + 0x98))(lVar5 + 0x80,0x10,s);
    }
    else {
      __buf = (ushort *)((*(long *)(lVar6 + 0x38) + *(long *)(lVar6 + 0x40)) - lVar8);
      if (opCode != 9) {
        if (opCode == 8) {
          if (uVar14 < 2) {
            puVar11 = (uchar *)0x0;
            ppVar9 = (protocol *)0x0;
            uVar14 = 0;
          }
          else {
            uVar13 = *__buf << 8 | *__buf >> 8;
            ppVar9 = (protocol *)0x0;
            puVar11 = (uchar *)0x0;
            uVar14 = 0;
            if (2 < (ushort)(uVar13 - 0x3ec) &&
                (0xbab < (ushort)(uVar13 - 0x3f4) && 0xf05f < (ushort)(uVar13 + 0xec78))) {
              puVar11 = (uchar *)(lVar8 + -2);
              ppVar9 = (protocol *)(__buf + 1);
              bVar15 = protocol::isValidUtf8(ppVar9,puVar11,0);
              uVar14 = (uint)uVar13;
              if (!bVar15) {
                ppVar9 = (protocol *)0x0;
                puVar11 = (uchar *)0x0;
                uVar14 = 0;
              }
            }
          }
          goto LAB_0014d47b;
        }
        goto LAB_0014d274;
      }
      WebSocket<true,_true>::send((WebSocket<true,_true> *)s,uVar14,__buf,10,0);
      bVar15 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                        *)(lVar5 + 0x70));
      if (bVar15) goto LAB_0014d274;
      (**(code **)(lVar5 + 0x78))(lVar5 + 0x60,0x10,s);
    }
    iVar3 = us_socket_is_closed(1,s);
    if (iVar3 != 0) {
      return true;
    }
    if (*(char *)(lVar6 + 0x5c) != '\0') {
      return true;
    }
LAB_0014d274:
    std::__cxx11::string::resize
              ((ulong)(lVar6 + 0x38),
               (char)*(undefined8 *)(lVar6 + 0x40) - (char)*(undefined4 *)(lVar6 + 0x58));
    *(undefined4 *)(lVar6 + 0x58) = 0;
    return false;
  }
  lVar8 = *(long *)(lVar6 + 0x40);
  local_64 = (undefined1)opCode;
  if (bVar15 || !fin) {
    if (lVar8 == 0) {
      std::__cxx11::string::reserve(lVar6 + 0x38);
      lVar8 = *(long *)(lVar6 + 0x40);
    }
  }
  else if (lVar8 == 0) {
    if (*(char *)(lVar6 + 0x5d) == '\x02') {
      *(undefined1 *)(lVar6 + 0x5d) = 1;
      uVar4 = us_socket_context(1,s);
      uVar4 = us_socket_context_loop(1,uVar4);
      lVar8 = us_loop_ext(uVar4);
      compressed_00._M_str = data;
      compressed_00._M_len = length;
      InflationStream::inflate
                (&local_48,*(InflationStream **)(lVar8 + 0xe0),*(ZlibContext **)(lVar8 + 0xd8),
                 compressed_00,*(size_t *)(lVar5 + 0xa0));
      sVar10 = extraout_RDX_01;
      length = local_48.first._M_len;
      data = local_48.first._M_str;
      if (local_48.second != true) goto LAB_0014cfd6;
    }
    if ((opCode != 1) ||
       (bVar15 = protocol::isValidUtf8((protocol *)data,(uchar *)length,sVar10), bVar15)) {
      bVar15 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                        *)(lVar5 + 0x10));
      if (bVar15) {
        return false;
      }
      (**(code **)(lVar5 + 0x18))(lVar5,0x10,s,length,data,local_64);
      goto LAB_0014d430;
    }
    goto LAB_0014cfd6;
  }
  pcVar12 = (char *)(lVar6 + 0x38);
  uVar4 = us_socket_context(1,s);
  lVar7 = us_socket_context_ext(1,uVar4);
  if (lVar8 + length <= *(ulong *)(lVar7 + 0xa0)) {
    std::__cxx11::string::append(pcVar12,(ulong)data);
    if (bVar15 || !fin) {
      return false;
    }
    if (*(char *)(lVar6 + 0x5d) == '\x02') {
      *(undefined1 *)(lVar6 + 0x5d) = 1;
      std::__cxx11::string::append(pcVar12);
      uVar4 = us_socket_context(1,s);
      uVar4 = us_socket_context_loop(1,uVar4);
      lVar8 = us_loop_ext(uVar4);
      compressed._M_len = *(long *)(lVar6 + 0x40) - 4;
      compressed._M_str = *(char **)(lVar6 + 0x38);
      InflationStream::inflate
                (&local_48,*(InflationStream **)(lVar8 + 0xe0),*(ZlibContext **)(lVar8 + 0xd8),
                 compressed,*(size_t *)(lVar5 + 0xa0));
      sVar10 = extraout_RDX_00;
      ppVar9 = (protocol *)local_48.first._M_str;
      puVar11 = (uchar *)local_48.first._M_len;
      if (local_48.second != true) goto LAB_0014cfd6;
    }
    else {
      sVar10 = extraout_RDX;
      ppVar9 = *(protocol **)pcVar12;
      puVar11 = *(uchar **)(lVar6 + 0x40);
    }
    if ((opCode != 1) || (bVar15 = protocol::isValidUtf8(ppVar9,puVar11,sVar10), bVar15)) {
      bVar15 = fu2::abi_400::detail::type_erasure::tables::
               vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
               ::empty((vtable<fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                        *)(lVar5 + 0x10));
      if (!bVar15) {
        (**(code **)(lVar5 + 0x18))(lVar5,0x10,s,puVar11,ppVar9,local_64);
        iVar3 = us_socket_is_closed(1,s);
        if (iVar3 != 0) {
          return true;
        }
        if (*(char *)(lVar6 + 0x5c) != '\0') {
          return true;
        }
      }
      *(undefined8 *)(lVar6 + 0x40) = 0;
      **(undefined1 **)pcVar12 = 0;
      return false;
    }
  }
LAB_0014cfd6:
  us_socket_close(1,s);
  return true;
}

Assistant:

static bool handleFragment(char *data, size_t length, unsigned int remainingBytes, int opCode, bool fin, uWS::WebSocketState<isServer> *webSocketState, void *s) {
        /* WebSocketData and WebSocketContextData */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL, us_socket_context(SSL, (us_socket_t *) s));
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        /* Is this a non-control frame? */
        if (opCode < 3) {
            /* Did we get everything in one go? */
            if (!remainingBytes && fin && !webSocketData->fragmentBuffer.length()) {

                /* Handle compressed frame */
                if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                        webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                        LoopData *loopData = (LoopData *) us_loop_ext(us_socket_context_loop(SSL, us_socket_context(SSL, (us_socket_t *) s)));
                        auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {data, length}, webSocketContextData->maxPayloadLength);
                        if (!valid) {
                            forceClose(webSocketState, s);
                            return true;
                        } else {
                            data = (char *) inflatedFrame.data();
                            length = inflatedFrame.length();
                        }
                }

                /* Check text messages for Utf-8 validity */
                if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                    forceClose(webSocketState, s);
                    return true;
                }

                /* Emit message event & break if we are closed or shut down when returning */
                if (webSocketContextData->messageHandler) {
                    webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                    if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                        return true;
                    }
                }
            } else {
                /* Allocate fragment buffer up front first time */
                if (!webSocketData->fragmentBuffer.length()) {
                    webSocketData->fragmentBuffer.reserve(length + remainingBytes);
                }
                /* Fragments forming a big message are not caught until appending them */
                if (refusePayloadLength(length + webSocketData->fragmentBuffer.length(), webSocketState, s)) {
                    forceClose(webSocketState, s);
                    return true;
                }
                webSocketData->fragmentBuffer.append(data, length);

                /* Are we done now? */
                // todo: what if we don't have any remaining bytes yet we are not fin? forceclose!
                if (!remainingBytes && fin) {

                    /* Handle compression */
                    if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                            webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                            // what's really the story here?
                            webSocketData->fragmentBuffer.append("....");

                            LoopData *loopData = (LoopData *) us_loop_ext(
                                us_socket_context_loop(SSL,
                                    us_socket_context(SSL, (us_socket_t *) s)
                                )
                            );

                            auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {webSocketData->fragmentBuffer.data(), webSocketData->fragmentBuffer.length() - 4}, webSocketContextData->maxPayloadLength);
                            if (!valid) {
                                forceClose(webSocketState, s);
                                return true;
                            } else {
                                data = (char *) inflatedFrame.data();
                                length = inflatedFrame.length();
                            }


                    } else {
                        // reset length and data ptrs
                        length = webSocketData->fragmentBuffer.length();
                        data = webSocketData->fragmentBuffer.data();
                    }

                    /* Check text messages for Utf-8 validity */
                    if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                        forceClose(webSocketState, s);
                        return true;
                    }

                    /* Emit message and check for shutdown or close */
                    if (webSocketContextData->messageHandler) {
                        webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                        if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                            return true;
                        }
                    }

                    /* If we shutdown or closed, this will be taken care of elsewhere */
                    webSocketData->fragmentBuffer.clear();
                }
            }
        } else {
            /* Control frames need the websocket to send pings, pongs and close */
            WebSocket<SSL, isServer> *webSocket = (WebSocket<SSL, isServer> *) s;

            if (!remainingBytes && fin && !webSocketData->controlTipLength) {
                if (opCode == CLOSE) {
                    auto closeFrame = protocol::parseClosePayload(data, length);
                    webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                    return true;
                } else {
                    if (opCode == PING) {
                        webSocket->send(std::string_view(data, length), (OpCode) OpCode::PONG);
                        if (webSocketContextData->pingHandler) {
                            webSocketContextData->pingHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    } else if (opCode == PONG) {
                        if (webSocketContextData->pongHandler) {
                            webSocketContextData->pongHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    }
                }
            } else {
                /* Here we never mind any size optimizations as we are in the worst possible path */
                webSocketData->fragmentBuffer.append(data, length);
                webSocketData->controlTipLength += (int) length;

                if (!remainingBytes && fin) {
                    char *controlBuffer = (char *) webSocketData->fragmentBuffer.data() + webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength;
                    if (opCode == CLOSE) {
                        protocol::CloseFrame closeFrame = protocol::parseClosePayload(controlBuffer, webSocketData->controlTipLength);
                        webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                        return true;
                    } else {
                        if (opCode == PING) {
                            webSocket->send(std::string_view(controlBuffer, webSocketData->controlTipLength), (OpCode) OpCode::PONG);
                            if (webSocketContextData->pingHandler) {
                                webSocketContextData->pingHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        } else if (opCode == PONG) {
                            if (webSocketContextData->pongHandler) {
                                webSocketContextData->pongHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        }
                    }

                    /* Same here, we do not care for any particular smart allocation scheme */
                    webSocketData->fragmentBuffer.resize(webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength);
                    webSocketData->controlTipLength = 0;
                }
            }
        }
        return false;
    }